

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextmarkdownimporter.cpp
# Opt level: O0

void CbDebugLog(char *msg,void *userdata)

{
  bool bVar1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_ffffffffffffffa8;
  QMessageLogger *in_stack_ffffffffffffffc0;
  QDebug *in_stack_ffffffffffffffc8;
  QDebug local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  char *t;
  
  t = *(char **)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  lcMD();
  anon_unknown.dwarf_1ad096f::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_RSI,in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_1ad096f::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x9fcf04);
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffc0,in_RDI,(int)((ulong)in_RSI >> 0x20),
               (char *)in_stack_ffffffffffffffa8,(char *)0x9fcf1a);
    QMessageLogger::debug();
    QDebug::operator<<(in_stack_ffffffffffffffc8,t);
    QDebug::~QDebug(&local_20);
    local_10 = 0;
  }
  if (*(char **)(in_FS_OFFSET + 0x28) == t) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void CbDebugLog(const char *msg, void *userdata)
{
    Q_UNUSED(userdata);
    qCDebug(lcMD) << msg;
}